

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedFixedWingAircraft.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::GED_EnhancedFixedWingAircraft::operator==
          (GED_EnhancedFixedWingAircraft *this,GED_EnhancedFixedWingAircraft *Value)

{
  KBOOL KVar1;
  
  KVar1 = GED_BasicFixedWingAircraft::operator!=
                    (&this->super_GED_BasicFixedWingAircraft,
                     &Value->super_GED_BasicFixedWingAircraft);
  if ((((KVar1) || (this->m_ui8SupFuelStatus != Value->m_ui8SupFuelStatus)) ||
      (this->m_ui8AirMaintStatus != Value->m_ui8AirMaintStatus)) ||
     (this->m_ui8PriAmmun != Value->m_ui8PriAmmun)) {
    KVar1 = false;
  }
  else {
    KVar1 = this->m_ui8SecAmmun == Value->m_ui8SecAmmun;
  }
  return KVar1;
}

Assistant:

KBOOL GED_EnhancedFixedWingAircraft::operator == ( const GED_EnhancedFixedWingAircraft & Value ) const
{
    if( GED_BasicFixedWingAircraft::operator!=( Value ) )   return false;
    if( m_ui8SupFuelStatus  != Value.m_ui8SupFuelStatus )   return false;
    if( m_ui8AirMaintStatus != Value.m_ui8AirMaintStatus )  return false;
    if( m_ui8PriAmmun       != Value.m_ui8PriAmmun )        return false;
    if( m_ui8SecAmmun       != Value.m_ui8SecAmmun )        return false;
    return true;
}